

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadIdentifier(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  variant local_178;
  variant local_138;
  string local_f8;
  function<bool_(char)> local_d8;
  undefined4 local_b4;
  variant local_b0;
  function<bool_(char)> local_60;
  undefined1 local_40 [8];
  string s;
  char c;
  Lexer *this_local;
  
  s.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_40);
  std::function<bool(char)>::function<bool(&)(char),void>
            ((function<bool(char)> *)&local_60,ctype_ident_start);
  bVar1 = GetCharIf(this,s.field_2._M_local_buf + 0xf,&local_60);
  std::function<bool_(char)>::~function(&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_40,s.field_2._M_local_buf[0xf]);
    while( true ) {
      std::function<bool(char)>::function<bool(&)(char),void>
                ((function<bool(char)> *)&local_d8,ctype_ident);
      bVar1 = GetCharIf(this,s.field_2._M_local_buf + 0xf,&local_d8);
      std::function<bool_(char)>::~function(&local_d8);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)local_40,s.field_2._M_local_buf[0xf]);
    }
    util::lowercase(&local_f8,(string *)local_40);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"true");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"false");
      if (!bVar1) {
        util::variant::variant(&local_178,(string *)local_40);
        Token::Token(__return_storage_ptr__,Identifier,&local_178);
        util::variant::~variant(&local_178);
        goto LAB_00175d13;
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"true");
    util::variant::variant(&local_138,bVar1);
    Token::Token(__return_storage_ptr__,Boolean,&local_138);
    util::variant::~variant(&local_138);
  }
  else {
    util::variant::variant(&local_b0);
    Token::Token(__return_storage_ptr__,Invalid,&local_b0);
    util::variant::~variant(&local_b0);
  }
LAB_00175d13:
  local_b4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadIdentifier()
	{
		char c = '\0';
		std::string s;

		if (!this->GetCharIf(c, ctype_ident_start))
			return Token();

		s += c;

		while (this->GetCharIf(c, ctype_ident))
		{
			s += c;
		}

		s = util::lowercase(s);

		if (s == "true" || s == "false")
		{
			return Token(Token::Boolean, s == "true" ? true : false);
		}
		else
		{
			return Token(Token::Identifier, s);
		}
	}